

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::DenseSupportVectors::SerializeWithCachedSizes
          (DenseSupportVectors *this,CodedOutputStream *output)

{
  int iVar1;
  Type *value;
  int index;
  
  iVar1 = (this->vectors_).super_RepeatedPtrFieldBase.current_size_;
  for (index = 0; iVar1 != index; index = index + 1) {
    value = google::protobuf::internal::RepeatedPtrFieldBase::
            Get<google::protobuf::RepeatedPtrField<CoreML::Specification::DenseVector>::TypeHandler>
                      (&(this->vectors_).super_RepeatedPtrFieldBase,index);
    google::protobuf::internal::WireFormatLite::WriteMessage(1,&value->super_MessageLite,output);
  }
  return;
}

Assistant:

void DenseSupportVectors::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.DenseSupportVectors)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated .CoreML.Specification.DenseVector vectors = 1;
  for (unsigned int i = 0, n = this->vectors_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      1, this->vectors(i), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.DenseSupportVectors)
}